

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  basic_format_specs<wchar_t> *pbVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  format_specs local_e8;
  ulong local_b8;
  ulong uStack_b0;
  wchar_t local_a8 [2];
  wchar_t awStack_a0 [2];
  wchar_t local_98;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::dec_writer>
  local_88;
  
  uVar1 = (ulong)this->abs_value;
  uVar2 = *(ulong *)((long)&this->abs_value + 8);
  auVar8 = (undefined1  [16])this->abs_value;
  uVar6 = 1;
  if ((uVar1 < 10) <= uVar2) {
    uVar7 = 4;
    do {
      uVar6 = uVar7;
      uVar5 = auVar8._8_8_;
      uVar4 = auVar8._0_8_;
      if (uVar5 == 0 && (ulong)(99 < uVar4) <= -uVar5) {
        uVar6 = uVar6 - 2;
        goto LAB_001c058b;
      }
      if (uVar5 == 0 && (ulong)(999 < uVar4) <= -uVar5) {
        uVar6 = uVar6 - 1;
        goto LAB_001c058b;
      }
      if (uVar5 < (uVar4 < 10000)) goto LAB_001c058b;
      auVar8 = __udivti3(uVar4,uVar5,10000,0);
      uVar7 = uVar6 + 4;
    } while (uVar5 != 0 || -uVar5 < (ulong)(99999 < uVar4));
    uVar6 = uVar6 + 1;
  }
LAB_001c058b:
  pbVar3 = this->specs;
  local_88.prefix.size_ = (size_t)this->prefix_size;
  local_e8.fill.data_[5] = (pbVar3->fill).data_[5];
  local_e8.width = pbVar3->width;
  local_e8.precision = pbVar3->precision;
  uStack_b0._0_1_ = pbVar3->type;
  uStack_b0._1_3_ = *(undefined3 *)&pbVar3->field_0x9;
  uStack_b0._4_4_ = (pbVar3->fill).data_[0];
  local_e8.fill.data_._4_8_ = *(undefined8 *)((pbVar3->fill).data_ + 1);
  local_e8.fill.data_._12_8_ = *(undefined8 *)((pbVar3->fill).data_ + 3);
  uVar4 = uVar6 + local_88.prefix.size_;
  local_e8._9_1_ = SUB31(uStack_b0._1_3_,0);
  local_88.fill = uStack_b0._4_4_;
  local_e8._8_8_ = uStack_b0;
  if ((local_e8._9_1_ & 0xf) == 4) {
    uVar5 = local_e8._0_8_ & 0xffffffff;
    local_88.size_ = uVar4;
    local_88.padding = 0;
    if (uVar4 <= uVar5) {
      local_88.size_ = uVar5;
      local_88.padding = uVar5 - uVar4;
    }
  }
  else {
    local_88.padding = 0;
    uVar7 = local_e8.precision - uVar6;
    if (uVar7 != 0 && (int)uVar6 <= (int)local_e8.precision) {
      local_88.fill = L'0';
    }
    if (uVar7 != 0 && (int)uVar6 <= (int)local_e8.precision) {
      uVar4 = (uint)local_e8.precision + local_88.prefix.size_;
      local_88.padding = (ulong)uVar7;
    }
    local_88.size_ = uVar4;
    if ((uStack_b0 & 0xf00) == 0) {
      local_e8._8_8_ = uStack_b0 | 0x200;
    }
  }
  local_88.prefix.data_ = this->prefix;
  local_b8 = local_e8._0_8_;
  local_a8 = (wchar_t  [2])local_e8.fill.data_._4_8_;
  awStack_a0 = (wchar_t  [2])local_e8.fill.data_._12_8_;
  local_98 = local_e8.fill.data_[5];
  local_88.f.abs_value._0_8_ = uVar1;
  local_88.f.abs_value._8_8_ = uVar2;
  local_88.f.num_digits = uVar6;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::dec_writer>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_e8,&local_88);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }